

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall Table::dbOpen(Table *this,string *filename)

{
  Pager *this_00;
  char *node;
  string sStack_38;
  
  this_00 = this->pager;
  std::__cxx11::string::string((string *)&sStack_38,(string *)filename);
  Pager::_open(this_00,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  this->rootPageNum = 0;
  if (this->pager->numOfPages == 0) {
    node = Pager::getPage(this->pager,0);
    initialize_leaf_node(node);
    set_node_root(node,true);
  }
  return;
}

Assistant:

void Table::dbOpen(std::string filename) {
    pager->_open(filename);
    rootPageNum = 0;
    if (pager->getNumOfPages() == 0) {
        char *rootNode = pager->getPage(0);
        initialize_leaf_node(rootNode);
		set_node_root(rootNode, true);
    }
}